

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O2

ssize_t write_data_block(archive_write_disk *a,char *buff,size_t size)

{
  long lVar1;
  wchar_t wVar2;
  long lVar3;
  __off_t _Var4;
  ssize_t sVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  int error_number;
  size_t __n;
  __blksize_t _Var11;
  size_t sStack_40;
  
  if (size == 0) {
    sStack_40 = 0;
  }
  else {
    lVar8 = a->filesize;
    if ((lVar8 == 0) || (a->fd < L'\0')) {
      pcVar10 = "Attempt to write to an empty file";
      error_number = 0;
LAB_00589f32:
      archive_set_error(&a->archive,error_number,pcVar10);
      sStack_40 = 0xffffffffffffffec;
    }
    else {
      if ((a->flags & L'က') == L'\0') {
        _Var11 = 0;
      }
      else {
        wVar2 = lazy_stat(a);
        if (wVar2 != L'\0') {
          return (long)wVar2;
        }
        lVar8 = a->filesize;
        _Var11 = a->pst->st_blksize;
      }
      sStack_40 = size;
      if ((-1 < lVar8) &&
         (sVar9 = lVar8 - a->offset, sStack_40 = size, lVar8 < (long)(a->offset + size))) {
        size = sVar9;
        sStack_40 = sVar9;
      }
      while (size != 0) {
        if (_Var11 == 0) {
          lVar8 = a->offset;
          sVar9 = size;
          __n = size;
          pcVar10 = buff;
        }
        else {
          for (lVar7 = 0; (pcVar10 = buff + lVar7, pcVar10 < buff + size && (*pcVar10 == '\0'));
              lVar7 = lVar7 + 1) {
          }
          lVar1 = a->offset;
          lVar8 = lVar1 + lVar7;
          a->offset = lVar8;
          sVar9 = size - lVar7;
          if (sVar9 == 0) {
            return sStack_40;
          }
          lVar3 = (lVar8 / _Var11 + 1) * _Var11;
          __n = (lVar3 - lVar1) - lVar7;
          if ((long)(size + lVar1) <= lVar3) {
            __n = sVar9;
          }
        }
        wVar2 = a->fd;
        if (lVar8 != a->fd_offset) {
          _Var4 = lseek(wVar2,lVar8,0);
          if (_Var4 < 0) {
            piVar6 = __errno_location();
            archive_set_error(&a->archive,*piVar6,"Seek failed");
            return -0x1e;
          }
          a->fd_offset = a->offset;
          wVar2 = a->fd;
        }
        sVar5 = write(wVar2,pcVar10,__n);
        if (sVar5 < 0) {
          piVar6 = __errno_location();
          error_number = *piVar6;
          pcVar10 = "Write failed";
          goto LAB_00589f32;
        }
        buff = pcVar10 + sVar5;
        a->total_bytes_written = a->total_bytes_written + sVar5;
        lVar8 = a->offset + sVar5;
        a->offset = lVar8;
        a->fd_offset = lVar8;
        size = sVar9 - sVar5;
      }
    }
  }
  return sStack_40;
}

Assistant:

static ssize_t
write_data_block(struct archive_write_disk *a, const char *buff, size_t size)
{
	uint64_t start_size = size;
	ssize_t bytes_written = 0;
	ssize_t block_size = 0, bytes_to_write;

	if (size == 0)
		return (ARCHIVE_OK);

	if (a->filesize == 0 || a->fd < 0) {
		archive_set_error(&a->archive, 0,
		    "Attempt to write to an empty file");
		return (ARCHIVE_WARN);
	}

	if (a->flags & ARCHIVE_EXTRACT_SPARSE) {
#if HAVE_STRUCT_STAT_ST_BLKSIZE
		int r;
		if ((r = lazy_stat(a)) != ARCHIVE_OK)
			return (r);
		block_size = a->pst->st_blksize;
#else
		/* XXX TODO XXX Is there a more appropriate choice here ? */
		/* This needn't match the filesystem allocation size. */
		block_size = 16*1024;
#endif
	}

	/* If this write would run beyond the file size, truncate it. */
	if (a->filesize >= 0 && (int64_t)(a->offset + size) > a->filesize)
		start_size = size = (size_t)(a->filesize - a->offset);

	/* Write the data. */
	while (size > 0) {
		if (block_size == 0) {
			bytes_to_write = size;
		} else {
			/* We're sparsifying the file. */
			const char *p, *end;
			int64_t block_end;

			/* Skip leading zero bytes. */
			for (p = buff, end = buff + size; p < end; ++p) {
				if (*p != '\0')
					break;
			}
			a->offset += p - buff;
			size -= p - buff;
			buff = p;
			if (size == 0)
				break;

			/* Calculate next block boundary after offset. */
			block_end
			    = (a->offset / block_size + 1) * block_size;

			/* If the adjusted write would cross block boundary,
			 * truncate it to the block boundary. */
			bytes_to_write = size;
			if (a->offset + bytes_to_write > block_end)
				bytes_to_write = block_end - a->offset;
		}
		/* Seek if necessary to the specified offset. */
		if (a->offset != a->fd_offset) {
			if (lseek(a->fd, a->offset, SEEK_SET) < 0) {
				archive_set_error(&a->archive, errno,
				    "Seek failed");
				return (ARCHIVE_FATAL);
			}
			a->fd_offset = a->offset;
		}
		bytes_written = write(a->fd, buff, bytes_to_write);
		if (bytes_written < 0) {
			archive_set_error(&a->archive, errno, "Write failed");
			return (ARCHIVE_WARN);
		}
		buff += bytes_written;
		size -= bytes_written;
		a->total_bytes_written += bytes_written;
		a->offset += bytes_written;
		a->fd_offset = a->offset;
	}
	return (start_size - size);
}